

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::
UnaryExpr<const_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&>
::streamReconstructedExpression
          (UnaryExpr<const_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&>
           *this,ostream *os)

{
  long *local_38;
  long local_30;
  long local_28 [2];
  
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,Detail::unprintableString_abi_cxx11_,
             DAT_001c5c60 + Detail::unprintableString_abi_cxx11_);
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_38,local_30);
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            os << Catch::Detail::stringify( m_lhs );
        }